

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

idx_t duckdb::TemplatedMatch<false,unsigned_int,duckdb::NotEquals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  long lVar7;
  sel_t *psVar8;
  bool bVar9;
  const_reference pvVar10;
  idx_t i_1;
  idx_t iVar11;
  uint uVar12;
  idx_t iVar13;
  ValidityMask *lhs_validity;
  idx_t i;
  idx_t iVar14;
  idx_t local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  long local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar10 = vector<unsigned_long,_true>::get<true>(&rhs_layout->offsets,col_idx);
  uVar12 = 1 << ((byte)col_idx & 7);
  vVar5 = *pvVar10;
  if (puVar1 == (unsigned_long *)0x0) {
    local_90 = 0;
    for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
      psVar6 = sel->sel_vector;
      iVar11 = iVar14;
      if (psVar6 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar6[iVar14];
      }
      psVar8 = pSVar2->sel_vector;
      iVar13 = iVar11;
      if (psVar8 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar8[iVar11];
      }
      lVar7 = *(long *)(pdVar4 + iVar11 * 8);
      local_38 = ((long)(rhs_layout->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(rhs_layout->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (((uVar12 & *(byte *)(lVar7 + (col_idx >> 3))) != 0) &&
         (*(int *)(pdVar3 + iVar13 * 4) != *(int *)(lVar7 + vVar5))) {
        psVar6[local_90] = (sel_t)iVar11;
        local_90 = local_90 + 1;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
    }
  }
  else {
    local_90 = 0;
    for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
      iVar11 = iVar14;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar11 = (idx_t)sel->sel_vector[iVar14];
      }
      psVar6 = pSVar2->sel_vector;
      iVar13 = iVar11;
      if (psVar6 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar6[iVar11];
      }
      bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>,
                         iVar13);
      lVar7 = *(long *)(pdVar4 + iVar11 * 8);
      local_38 = ((long)(rhs_layout->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(rhs_layout->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (((bVar9) && ((*(byte *)(lVar7 + (col_idx >> 3)) & uVar12) != 0)) &&
         (*(int *)(pdVar3 + iVar13 * 4) != *(int *)(lVar7 + vVar5))) {
        sel->sel_vector[local_90] = (sel_t)iVar11;
        local_90 = local_90 + 1;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
    }
  }
  return local_90;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}